

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentSelector.hpp
# Opt level: O0

Status __thiscall
AO::BehaviorTree::Version_1::Details::ConcurrentSelector<Agent,_short>::execute
          (ConcurrentSelector<Agent,_short> *this,EntityPtr entity,short args)

{
  Status SVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ChildrenList *this_00;
  __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  mapped_type *pmVar7;
  element_type *peVar8;
  reference ppVar9;
  pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>
  *pair;
  iterator __end0_1;
  iterator __begin0_1;
  ChildrenStatusMap *__range4_1;
  bool sawAllSuccess;
  bool sawAllFails;
  bool sawSuccess;
  Status status;
  shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *child;
  iterator __end0;
  iterator __begin0;
  ChildrenList *__range4;
  short args_local;
  EntityPtr entity_local;
  ConcurrentSelector<Agent,_short> *this_local;
  
  bVar4 = std::
          unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
          ::empty(&this->childrenStatus);
  if (bVar4) {
    initialize(this,entity);
  }
  this_00 = &(this->super_CompositeNode<Agent,_short>).children;
  __end0 = std::
           vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ::begin(this_00);
  child = (shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *)
          std::
          vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
          ::end(this_00);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
                                     *)&child), bVar4) {
    this_01 = (__shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
                 ::operator*(&__end0);
    pmVar7 = std::
             unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
             ::operator[](&this->childrenStatus,(key_type *)this_01);
    if (*pmVar7 == Running) {
      peVar8 = std::
               __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      iVar6 = (*(peVar8->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar8,entity,(ulong)(uint)(int)args);
      if ((char)iVar6 == '\x01') {
        if (this->failPolicy == FailOnOne) {
          initialize(this,entity);
          return Failure;
        }
        pmVar7 = std::
                 unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
                 ::operator[](&this->childrenStatus,(key_type *)this_01);
        *pmVar7 = Failure;
      }
      else if ((char)iVar6 == '\0') {
        pmVar7 = std::
                 unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
                 ::operator[](&this->childrenStatus,(key_type *)this_01);
        *pmVar7 = Success;
      }
    }
    pmVar7 = std::
             unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
             ::operator[](&this->childrenStatus,(key_type *)this_01);
    if ((*pmVar7 == Failure) && (this->failPolicy == FailOnAll)) {
      peVar8 = std::
               __shared_ptr_access<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      iVar6 = (*(peVar8->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar8,entity,(ulong)(uint)(int)args);
      pmVar7 = std::
               unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
               ::operator[](&this->childrenStatus,(key_type *)this_01);
      *pmVar7 = (mapped_type)iVar6;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_*,_std::vector<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>_>
    ::operator++(&__end0);
  }
  bVar3 = false;
  bVar4 = true;
  bVar2 = true;
  __end0_1 = std::
             unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
             ::begin(&this->childrenStatus);
  pair = (pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>
          *)std::
            unordered_map<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>_>
            ::end(&this->childrenStatus);
  do {
    bVar5 = std::__detail::operator!=
                      (&__end0_1.
                        super__Node_iterator_base<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_false>
                       ,(_Node_iterator_base<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_false>
                         *)&pair);
    if (!bVar5) {
      if ((this->failPolicy == FailOnAll) && (bVar4)) {
        initialize(this,entity);
        this_local._7_1_ = Failure;
      }
      else if (((this->succeedPolicy == SuccessOnAll) && (bVar2)) ||
              ((this->succeedPolicy == SuccessOnOne && (bVar3)))) {
        initialize(this,entity);
        this_local._7_1_ = Success;
      }
      else {
        this_local._7_1_ = Running;
      }
      return this_local._7_1_;
    }
    ppVar9 = std::__detail::
             _Node_iterator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_false,_false>
             ::operator*(&__end0_1);
    SVar1 = ppVar9->second;
    if (SVar1 == Success) {
      if ((this->succeedPolicy == SuccessOnOne) && (this->failPolicy != FailOnOne)) {
        initialize(this,entity);
        return Success;
      }
      bVar3 = true;
      bVar4 = false;
    }
    else if (SVar1 == Failure) {
      if (this->failPolicy == FailOnOne) {
        initialize(this,entity);
        return Failure;
      }
      bVar2 = false;
    }
    else if (SVar1 == Running) {
      if ((this->failPolicy == FailOnAll) && (this->succeedPolicy == SuccessOnAll)) {
        return Running;
      }
      bVar4 = false;
      bVar2 = false;
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_false,_false>
    ::operator++(&__end0_1);
  } while( true );
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (childrenStatus.empty())
						{
							initialize(entity);
						}
						for (auto &child : this->children)
						{
							if (childrenStatus[child] == Status::Running)
							{
								Status const status = child->execute(entity, args...);
								if (status == Status::Failure)
								{
									if (failPolicy == FailurePolicy::FailOnOne)
									{
										initialize(entity);
										return Status::Failure;
									}
									else
									{
										childrenStatus[child] = Status::Failure;
									}
								}
								else if (status == Status::Success)
								{
									childrenStatus[child] = Status::Success;
								}
							}
							if (childrenStatus[child] == Status::Failure && failPolicy == FailurePolicy::FailOnAll)
							{
								childrenStatus[child] = child->execute(entity, args...);
							}
						}
						bool sawSuccess = false;
						bool sawAllFails = true;
						bool sawAllSuccess = true;
						for (auto &pair : childrenStatus)
						{
							switch (pair.second)
							{
							case Status::Success:
								if (succeedPolicy == SuccessPolicy::SuccessOnOne && failPolicy != FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Success;
								}
								else
								{
									sawSuccess = true;
									sawAllFails = false;
								}
								break;
							case Status::Failure:
								if (failPolicy == FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Failure;
								}
								else
								{
									sawAllSuccess = false;
								}
								break;
							case Status::Running:
								if (failPolicy == FailurePolicy::FailOnAll && succeedPolicy == SuccessPolicy::SuccessOnAll)
								{
									return Status::Running;
								}
								sawAllFails = false;
								sawAllSuccess = false;
								break;
							default:
								break;
							}
						}
						if (failPolicy == FailurePolicy::FailOnAll && sawAllFails)
						{
							initialize(entity);
							return Status::Failure;
						}
						else if ((succeedPolicy == SuccessPolicy::SuccessOnAll && sawAllSuccess) || (succeedPolicy == SuccessPolicy::SuccessOnOne && sawSuccess))
						{
							initialize(entity);
							return Status::Success;
						}
						else
						{
							return Status::Running;
						}
					}